

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFLAG_Register.cpp
# Opt level: O0

bool __thiscall SFLAG_Register::getFlag(SFLAG_Register *this,string *flagName)

{
  bool bVar1;
  string *flagName_local;
  SFLAG_Register *this_local;
  
  bVar1 = std::operator==(flagName,"CF");
  if (bVar1) {
    this_local._7_1_ = getFlag(this,0);
  }
  else {
    bVar1 = std::operator==(flagName,"PF");
    if (bVar1) {
      this_local._7_1_ = getFlag(this,2);
    }
    else {
      bVar1 = std::operator==(flagName,"AF");
      if (bVar1) {
        this_local._7_1_ = getFlag(this,4);
      }
      else {
        bVar1 = std::operator==(flagName,"ZF");
        if (bVar1) {
          this_local._7_1_ = getFlag(this,6);
        }
        else {
          bVar1 = std::operator==(flagName,"SF");
          if (bVar1) {
            this_local._7_1_ = getFlag(this,7);
          }
          else {
            bVar1 = std::operator==(flagName,"TP");
            if (bVar1) {
              this_local._7_1_ = getFlag(this,8);
            }
            else {
              bVar1 = std::operator==(flagName,"IF");
              if (bVar1) {
                this_local._7_1_ = getFlag(this,9);
              }
              else {
                bVar1 = std::operator==(flagName,"OF");
                if (bVar1) {
                  this_local._7_1_ = getFlag(this,0xb);
                }
                else {
                  bVar1 = std::operator==(flagName,"NT");
                  if (bVar1) {
                    this_local._7_1_ = getFlag(this,0xe);
                  }
                  else {
                    bVar1 = std::operator==(flagName,"RF");
                    if (bVar1) {
                      this_local._7_1_ = getFlag(this,0x10);
                    }
                    else {
                      bVar1 = std::operator==(flagName,"VM");
                      if (bVar1) {
                        this_local._7_1_ = getFlag(this,0x11);
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SFLAG_Register::getFlag(std::string flagName)
{
	if (flagName == "CF") return getFlag(0);
	else if (flagName == "PF") return getFlag(2);
	else if (flagName == "AF") return getFlag(4);
	else if (flagName == "ZF") return getFlag(6);
	else if (flagName == "SF") return getFlag(7);
	else if (flagName == "TP") return getFlag(8);
	else if (flagName == "IF") return getFlag(9);
	else if (flagName == "OF") return getFlag(11);
	else if (flagName == "NT") return getFlag(14);
	else if (flagName == "RF") return getFlag(16);
	else if (flagName == "VM") return getFlag(17);
	else
	{
		// TODO: throw a triple-step error.
		// Just return 0 for now.
		return 0;
	}
}